

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

bool __thiscall
QTemporaryFileEngine::materializeUnnamedFile
          (QTemporaryFileEngine *this,QString *newName,MaterializationMode mode)

{
  QAbstractFileEnginePrivate *pQVar1;
  Data *data;
  bool bVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  QString *newName_00;
  char *__from;
  long in_FS_OFFSET;
  QFileSystemEntry dst;
  anon_class_32_2_9f8265eb local_c8;
  QByteArray local_a8;
  NativePath local_90;
  undefined1 local_78 [52];
  qint16 qStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((QByteArray *)&local_c8,
                     *(int *)&(this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d[3].q_ptr
                     ,10);
  local_78._24_8_ = local_c8.materializeAt.src.d.size;
  local_78._16_8_ = local_c8.materializeAt.src.d.ptr;
  local_78._8_8_ = local_c8.materializeAt.src.d.d;
  local_78._0_8_ = anon_var_dwarf_4dd9a3;
  local_c8.materializeAt.src.d.d = (Data *)0x0;
  local_c8.materializeAt.src.d.ptr = (char *)0x0;
  local_c8.materializeAt.src.d.size = 0;
  QStringBuilder<const_char_(&)[15],_QByteArray>::convertTo<QByteArray>
            (&local_a8,(QStringBuilder<const_char_(&)[15],_QByteArray> *)local_78);
  if ((QArrayData *)local_78._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._8_8_,1,0x10);
    }
  }
  if (&(local_c8.materializeAt.src.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_c8.materializeAt.src.d.d)->super_QArrayData,1,0x10);
    }
  }
  __from = local_a8.d.ptr;
  data = local_a8.d.d;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.materializeAt.src.d.d = local_a8.d.d;
  local_c8.materializeAt.src.d.ptr = local_a8.d.ptr;
  local_c8.materializeAt.src.d.size = local_a8.d.size;
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.success.this = this;
  if (mode == NameIsTemplate) {
    bVar2 = materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()(&local_c8,newName);
    bVar5 = 1;
    if (bVar2) goto LAB_0025bacf;
  }
  else {
    stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_78,newName);
    QFileSystemEntry::nativeFilePath(&local_90,(QFileSystemEntry *)local_78);
    if (__from == (char *)0x0) {
      __from = "";
    }
    if (local_90.d.ptr == (char *)0x0) {
      local_90.d.ptr = "";
    }
    iVar3 = linkat(-100,__from,-100,local_90.d.ptr,0x400);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar3 == 0) {
      bVar2 = false;
      this->filePathIsTemplate = false;
      this->unnamedFile = false;
      pQVar1 = (this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d;
      QString::operator=((QString *)(pQVar1 + 1),(QString *)local_78);
      QByteArray::operator=
                ((QByteArray *)&pQVar1[1].errorString.d.ptr,(QByteArray *)(local_78 + 0x18));
      *(undefined4 *)&pQVar1[2]._vptr_QAbstractFileEnginePrivate = local_78._48_4_;
      *(qint16 *)((long)&pQVar1[2]._vptr_QAbstractFileEnginePrivate + 4) = qStack_44;
      mode = DontOverwrite;
    }
    else {
      piVar4 = __errno_location();
      bVar2 = true;
      if ((mode == Overwrite) && (*piVar4 == 0x11)) {
        newName_00 = this->templateName;
        bVar2 = materializeUnnamedFile::anon_class_32_2_9f8265eb::operator()(&local_c8,newName_00);
        if (bVar2) {
          QFSFileEngine::close(&this->super_QFSFileEngine,(int)newName_00);
          bVar2 = QFSFileEngine::rename_helper(&this->super_QFSFileEngine,newName,RenameOverwrite);
          mode = (MaterializationMode)bVar2;
        }
        else {
          mode = Overwrite;
        }
        bVar2 = false;
      }
    }
    bVar5 = (byte)mode;
    if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._24_8_,1,0x10);
      }
    }
    if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
    if (!bVar2) goto LAB_0025bacf;
  }
  piVar4 = __errno_location();
  QSystemError::string((QString *)local_78,NativeError,*piVar4);
  QAbstractFileEngine::setError((QAbstractFileEngine *)this,RenameError,(QString *)local_78);
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  bVar5 = 0;
LAB_0025bacf:
  if (&(local_c8.materializeAt.src.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.materializeAt.src.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_c8.materializeAt.src.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&data->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&data->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool QTemporaryFileEngine::materializeUnnamedFile(const QString &newName, QTemporaryFileEngine::MaterializationMode mode)
{
    Q_ASSERT(isUnnamedFile());

#ifdef LINUX_UNNAMED_TMPFILE
    Q_D(QFSFileEngine);
    const QByteArray src = "/proc/self/fd/" + QByteArray::number(d->fd);
    auto materializeAt = [=](const QFileSystemEntry &dst) {
        return ::linkat(AT_FDCWD, src, AT_FDCWD, dst.nativeFilePath(), AT_SYMLINK_FOLLOW) == 0;
    };
#else
    auto materializeAt = [](const QFileSystemEntry &) { return false; };
#endif

    auto success = [this](const QFileSystemEntry &entry) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d_func()->fileEntry = entry;
        return true;
    };

    auto materializeAsTemplate = [=](const QString &newName) {
        QTemporaryFileName tfn(newName);
        static const int maxAttempts = 16;
        for (int attempt = 0; attempt < maxAttempts; ++attempt) {
            tfn.generateNext();
            QFileSystemEntry entry(tfn.path, QFileSystemEntry::FromNativePath());
            if (materializeAt(entry))
                return success(entry);
        }
        return false;
    };

    if (mode == NameIsTemplate) {
        if (materializeAsTemplate(newName))
            return true;
    } else {
        // Use linkat to materialize the file
        QFileSystemEntry dst(newName);
        if (materializeAt(dst))
            return success(dst);

        if (errno == EEXIST && mode == Overwrite) {
            // retry by first creating a temporary file in the right dir
            if (!materializeAsTemplate(templateName))
                return false;

            // then rename the materialized file to target (same as renameOverwrite)
            QFSFileEngine::close();
            return QFSFileEngine::renameOverwrite(newName);
        }
    }

    // failed
    setError(QFile::RenameError, QSystemError(errno, QSystemError::NativeError).toString());
    return false;
}